

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_is_hdr_from_callbacks(stbi_io_callbacks *clbk,void *user)

{
  int iVar1;
  stbi__context s;
  stbi__context sStack_e8;
  
  sStack_e8.io.eof = clbk->eof;
  sStack_e8.img_buffer = sStack_e8.buffer_start;
  sStack_e8.io.read = clbk->read;
  sStack_e8.io.skip = clbk->skip;
  sStack_e8.read_from_callbacks = 1;
  sStack_e8.buflen = 0x80;
  sStack_e8.callback_already_read = 0;
  sStack_e8.io_user_data = user;
  sStack_e8.img_buffer_original = sStack_e8.img_buffer;
  stbi__refill_buffer(&sStack_e8);
  sStack_e8.img_buffer_original_end = sStack_e8.img_buffer_end;
  iVar1 = stbi__hdr_test(&sStack_e8);
  return iVar1;
}

Assistant:

static void stbi__start_callbacks(stbi__context *s, stbi_io_callbacks *c, void *user)
{
   s->io = *c;
   s->io_user_data = user;
   s->buflen = sizeof(s->buffer_start);
   s->read_from_callbacks = 1;
   s->callback_already_read = 0;
   s->img_buffer = s->img_buffer_original = s->buffer_start;
   stbi__refill_buffer(s);
   s->img_buffer_original_end = s->img_buffer_end;
}